

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::FeatureVectorizer_InputColumn
          (FeatureVectorizer_InputColumn *this)

{
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__FeatureVectorizer_InputColumn_0034c680;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  if (this != (FeatureVectorizer_InputColumn *)&_FeatureVectorizer_InputColumn_default_instance_) {
    protobuf_FeatureVectorizer_2eproto::InitDefaults();
  }
  (this->inputcolumn_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->inputdimensions_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

FeatureVectorizer_InputColumn::FeatureVectorizer_InputColumn()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_FeatureVectorizer_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.FeatureVectorizer.InputColumn)
}